

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (Rule *__return_storage_ptr__,RsRuleSyntax *syntax,ASTContext *context,
                 StatementBlockSymbol *ruleBlock)

{
  size_type sVar1;
  SyntaxNode *this;
  RsWeightClauseSyntax *pRVar2;
  RandJoinClauseSyntax *pRVar3;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sVar4;
  bool bVar5;
  int iVar6;
  RsCaseSyntax *syntax_00;
  RsRepeatSyntax *pRVar7;
  undefined4 extraout_var;
  RsProdItemSyntax *pRVar8;
  RsIfElseSyntax *pRVar9;
  Expression *pEVar10;
  ExpressionSyntax *pEVar11;
  undefined4 extraout_var_01;
  StatementBlockSymbol *pSVar12;
  undefined8 extraout_RAX;
  undefined4 extraout_var_02;
  Type *pTVar13;
  Diagnostic *diag;
  undefined4 extraout_var_03;
  logic_error *this_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_10;
  size_type extraout_RDX_11;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> tmp;
  long lVar14;
  Expression *this_01;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  iVar15;
  allocator<char> local_1a1;
  Compilation *local_1a0;
  pointer local_198;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  ProdItem item;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_148;
  ProdItem ifItem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  undefined1 local_a8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  iVar15 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&ruleBlock->super_Scope);
  blockIt.current = iVar15.m_begin.current.current;
  local_1a0 = ASTContext::getCompilation(context);
  prods.super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>.data_ =
       (pointer)prods.super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>.
                firstElement;
  prods.super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>.len = 0;
  prods.super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>.cap = 5;
  local_198 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
              data_;
  sVar1 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.size_;
  lVar14 = 0;
  src = extraout_RDX;
  do {
    sVar4.current = blockIt.current;
    local_148 = iVar15.m_end.current;
    if (sVar1 << 3 == lVar14) {
      pRVar2 = syntax->weightClause;
      if (pRVar2 == (RsWeightClauseSyntax *)0x0) {
        local_198 = (pointer)0x0;
        pEVar10 = (Expression *)0x0;
      }
      else {
        pEVar11 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pRVar2->weight);
        iVar6 = Expression::bind((int)pEVar11,(sockaddr *)context,0);
        pEVar10 = (Expression *)CONCAT44(extraout_var_01,iVar6);
        ASTContext::requireIntegral(context,pEVar10);
        sVar4 = blockIt;
        if (pRVar2->codeBlock == (RsProdSyntax *)0x0) {
          local_198 = (pointer)0x0;
          src = extraout_RDX_05;
        }
        else {
          if (blockIt.current == local_148.current) {
            assert::assertFailed
                      ("blockIt != blockRange.end()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                       ,0x5e8,
                       "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
                      );
          }
          Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++(&blockIt);
          pSVar12 = Symbol::as<slang::ast::StatementBlockSymbol>(sVar4.current);
          CodeBlockProd::CodeBlockProd((CodeBlockProd *)&item,pSVar12);
          local_a8._0_8_ = item._0_8_;
          local_a8._8_8_ = item.target;
          local_198 = (pointer)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          src = extraout_RDX_06;
        }
      }
      pRVar3 = syntax->randJoin;
      if ((pRVar3 == (RandJoinClauseSyntax *)0x0) ||
         (pRVar3->expr == (ParenthesizedExpressionSyntax *)0x0)) {
        this_01 = (Expression *)0x0;
      }
      else {
        iVar6 = Expression::bind((int)pRVar3->expr,(sockaddr *)context,0);
        this_01 = (Expression *)CONCAT44(extraout_var_02,iVar6);
        bVar5 = Expression::bad(this_01);
        src = extraout_RDX_07;
        if (!bVar5) {
          pTVar13 = not_null<const_slang::ast::Type_*>::get(&this_01->type);
          bVar5 = Type::isNumeric(pTVar13);
          src = extraout_RDX_08;
          if (!bVar5) {
            diag = ASTContext::addDiag(context,(DiagCode)0x890006,this_01->sourceRange);
            pTVar13 = not_null<const_slang::ast::Type_*>::get(&this_01->type);
            ast::operator<<(diag,pTVar13);
            src = extraout_RDX_09;
          }
        }
      }
      ifItem._0_8_ = iVar15.m_begin.current.current;
      while ((Symbol *)ifItem._0_8_ != local_148.current) {
        pSVar12 = Symbol::as<slang::ast::StatementBlockSymbol>((Symbol *)ifItem._0_8_);
        item.args.size_ = 0;
        item.super_ProdBase.kind = Item;
        item._4_4_ = 0;
        item.target = (RandSeqProductionSymbol *)0x0;
        item.args.data_ = (pointer)CONCAT44(item.args.data_._4_4_,4);
        StatementBlockSymbol::getStatement(pSVar12,context,(StatementContext *)&item);
        Statement::StatementContext::~StatementContext((StatementContext *)&item);
        Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++
                  ((specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)&ifItem);
        src = extraout_RDX_10;
      }
      iVar6 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                        (&prods.
                          super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>
                         ,(EVP_PKEY_CTX *)local_1a0,src);
      item._0_8_ = ruleBlock;
      not_null<slang::ast::StatementBlockSymbol_const*>::
      not_null<slang::ast::StatementBlockSymbol_const*,void>
                ((not_null<slang::ast::StatementBlockSymbol_const*> *)__return_storage_ptr__,
                 (StatementBlockSymbol **)&item);
      (__return_storage_ptr__->prods).data_ = (pointer)CONCAT44(extraout_var_03,iVar6);
      (__return_storage_ptr__->prods).size_ = extraout_RDX_11;
      __return_storage_ptr__->weightExpr = pEVar10;
      __return_storage_ptr__->randJoinExpr = this_01;
      *(undefined8 *)
       &(__return_storage_ptr__->codeBlock).
        super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
        _M_payload = local_a8._0_8_;
      (__return_storage_ptr__->codeBlock).
      super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _M_payload._M_value.block.ptr = (StatementBlockSymbol *)local_a8._8_8_;
      (__return_storage_ptr__->codeBlock).
      super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _M_engaged = SUB81(local_198,0);
      __return_storage_ptr__->isRandJoin = pRVar3 != (RandJoinClauseSyntax *)0x0;
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::~SmallVectorBase
                (&prods.super_SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>
                );
      return __return_storage_ptr__;
    }
    this = *(SyntaxNode **)((long)local_198 + lVar14);
    switch(this->kind) {
    case RsCase:
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::RsCaseSyntax>(this);
      item._0_8_ = createCaseProd(syntax_00,context);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)&prods,
                 (ProdBase **)&item);
      src = extraout_RDX_00;
      break;
    case RsCodeBlock:
      if (blockIt.current == local_148.current) {
        assert::assertFailed
                  ("blockIt != blockRange.end()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x5bd,
                   "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
                  );
      }
      Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++(&blockIt);
      pSVar12 = Symbol::as<slang::ast::StatementBlockSymbol>(sVar4.current);
      item._0_8_ = BumpAllocator::
                   emplace<slang::ast::RandSeqProductionSymbol::CodeBlockProd,slang::ast::StatementBlockSymbol_const&>
                             (&local_1a0->super_BumpAllocator,pSVar12);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)&prods,
                 (ProdBase **)&item);
      src = extraout_RDX_04;
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,&local_1a1);
      std::operator+(&local_50,&local_70,":");
      std::__cxx11::to_string((string *)(local_a8 + 0x18),0x5dd);
      std::operator+(&local_108,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a8 + 0x18));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifItem,
                     &local_108,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifItem,
                     "Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&item);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    case RsIfElse:
      pRVar9 = slang::syntax::SyntaxNode::as<slang::syntax::RsIfElseSyntax>(this);
      pEVar11 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pRVar9->condition);
      iVar6 = Expression::bind((int)pEVar11,(sockaddr *)context,0);
      pEVar10 = (Expression *)CONCAT44(extraout_var_00,iVar6);
      pRVar8 = not_null<slang::syntax::RsProdItemSyntax_*>::get(&pRVar9->ifItem);
      createProdItem(&ifItem,pRVar8,context);
      if (pRVar9->elseClause != (RsElseClauseSyntax *)0x0) {
        pRVar8 = not_null<slang::syntax::RsProdItemSyntax_*>::get(&pRVar9->elseClause->item);
        createProdItem((ProdItem *)&local_108,pRVar8,context);
        item._0_8_ = local_108._M_dataplus._M_p;
        item.target = (RandSeqProductionSymbol *)local_108._M_string_length;
        item.args.data_ = (pointer)local_108.field_2._M_allocated_capacity;
        item.args.size_ = local_108.field_2._8_8_;
      }
      bVar5 = Expression::bad(pEVar10);
      if (!bVar5) {
        ASTContext::requireBooleanConvertible(context,pEVar10);
      }
      local_108._M_dataplus._M_p =
           (pointer)BumpAllocator::
                    emplace<slang::ast::RandSeqProductionSymbol::IfElseProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                              (&local_1a0->super_BumpAllocator,pEVar10,&ifItem,
                               (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&item);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)&prods,
                 (ProdBase **)&local_108);
      src = extraout_RDX_02;
      break;
    case RsProdItem:
      pRVar8 = slang::syntax::SyntaxNode::as<slang::syntax::RsProdItemSyntax>(this);
      createProdItem(&item,pRVar8,context);
      ifItem._0_8_ = BumpAllocator::
                     emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
                               (&local_1a0->super_BumpAllocator,&item);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)&prods,
                 (ProdBase **)&ifItem);
      src = extraout_RDX_03;
      break;
    case RsRepeat:
      pRVar7 = slang::syntax::SyntaxNode::as<slang::syntax::RsRepeatSyntax>(this);
      pEVar11 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pRVar7->expr);
      iVar6 = Expression::bind((int)pEVar11,(sockaddr *)context,0);
      pRVar8 = not_null<slang::syntax::RsProdItemSyntax_*>::get(&pRVar7->item);
      createProdItem(&item,pRVar8,context);
      ifItem._0_8_ = BumpAllocator::
                     emplace<slang::ast::RandSeqProductionSymbol::RepeatProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&>
                               (&local_1a0->super_BumpAllocator,
                                (Expression *)CONCAT44(extraout_var,iVar6),&item);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)&prods,
                 (ProdBase **)&ifItem);
      ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar6));
      src = extraout_RDX_01;
    }
    lVar14 = lVar14 + 8;
  } while( true );
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}